

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  void **ppvVar7;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  ulong uVar8;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar3 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar6 = (void *)(ulong)current_widget->o->box_;
    pvVar5 = (void *)0x3e8;
    if (pvVar6 != (void *)0x0) {
      pvVar5 = pvVar6;
    }
    ppvVar7 = &boxmenu[0].user_data_;
    lVar4 = 0;
    do {
      if (pvVar5 == *ppvVar7) {
        Fl_Choice::value(i,(int)lVar4);
        return;
      }
      lVar4 = lVar4 + 1;
      ppvVar7 = ppvVar7 + 7;
    } while (lVar4 != 0x3d);
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar4 = -1;
    }
    else {
      lVar4 = (long)((int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar3 = (int)boxmenu[lVar4].user_data_;
    if ((iVar3 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      uVar8 = (ulong)boxmenu[lVar4].user_data_ & 0xffffffff;
      this = (Fl_Widget_Type *)Fl_Type::first;
      bVar2 = false;
      if (iVar3 == 1000) {
        uVar8 = 0;
        bVar2 = false;
      }
      do {
        if ((this->super_Fl_Type).selected != '\0') {
          iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
          if (iVar3 != 0) {
            this->o->box_ = (uchar)uVar8;
            Fl_Widget_Type::redraw(this);
            bVar2 = true;
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (bVar2) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->box(); if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        q->o->box((Fl_Boxtype)n);
        q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}